

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

int TextCopy(char *dst,char *src)

{
  long lVar1;
  char cVar2;
  
  if (dst != (char *)0x0) {
    cVar2 = *src;
    lVar1 = 0;
    if (cVar2 != '\0') {
      do {
        dst[lVar1] = cVar2;
        cVar2 = src[lVar1 + 1];
        lVar1 = lVar1 + 1;
      } while (cVar2 != '\0');
      dst = dst + lVar1;
    }
    *dst = '\0';
    return (int)lVar1;
  }
  return 0;
}

Assistant:

int TextCopy(char *dst, const char *src)
{
    int bytes = 0;

    if (dst != NULL)
    {
        while (*src != '\0')
        {
            *dst = *src;
            dst++;
            src++;

            bytes++;
        }

        *dst = '\0';
    }

    return bytes;
}